

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O1

Vec3 cross(Vec3 *v1,Vec3 *v2)

{
  float *in_RDI;
  Vec3 VVar1;
  
  VVar1.e[2] = -(v2->e[2] * v1->e[0] - v1->e[2] * v2->e[0]);
  VVar1.e[0] = v1->e[0] * v2->e[1] - v2->e[0] * v1->e[1];
  VVar1.e[1] = 0.0;
  *in_RDI = v1->e[1] * v2->e[2] - v2->e[1] * v1->e[2];
  in_RDI[1] = VVar1.e[2];
  in_RDI[2] = VVar1.e[0];
  return (Vec3)VVar1.e;
}

Assistant:

Vec3
cross(const Vec3 &v1, const Vec3 &v2) {
    return Vec3( (v1.e[1]*v2.e[2] - v1.e[2]*v2.e[1]),
                (-(v1.e[0]*v2.e[2] - v1.e[2]*v2.e[0])),
                (v1.e[0]*v2.e[1] - v1.e[1]*v2.e[0]));
}